

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2/include/catch2/catch.2.13.10.hpp:9760:37)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2_include_catch2_catch_2_13_10_hpp:9760:37)>
          *this,string *arg)

{
  bool bVar1;
  YesOrNo YVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BasicResult<Catch::clara::detail::ParseResultType> local_48;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)&temp);
  local_48.m_errorMessage._M_dataplus._M_p = (pointer)&local_48.m_errorMessage.field_2;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type = Ok
  ;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001952d8;
  local_48.m_errorMessage._M_string_length = 0;
  local_48.m_errorMessage.field_2._M_local_buf[0] = '\0';
  toLower(&mode,&temp);
  bVar1 = ::std::operator==(&mode,"yes");
  if (bVar1) {
    YVar2 = Yes;
  }
  else {
    bVar1 = ::std::operator==(&mode,"no");
    if (bVar1) {
      YVar2 = No;
    }
    else {
      bVar1 = ::std::operator==(&mode,"auto");
      YVar2 = Auto;
      if (!bVar1) {
        ::std::operator+(&local_88,"colour mode must be one of: auto, yes or no. \'",&temp);
        ::std::operator+(&local_68,&local_88,"\' not recognised");
        BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
                  (__return_storage_ptr__,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
        ::std::__cxx11::string::~string((string *)&local_88);
        goto LAB_0012c7f4;
      }
    }
  }
  ((this->m_lambda).config)->useColour = YVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001952d8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0012c7f4:
  ::std::__cxx11::string::~string((string *)&mode);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_48);
  ::std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }